

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O1

void __thiscall
nigel::IMC_Generator::generateMoveA
          (IMC_Generator *this,OperationType ot,shared_ptr<nigel::IM_Operator> *op)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78;
  shared_ptr<nigel::IM_Operator> local_68;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  _func_int **local_30;
  element_type *local_28;
  
  if (ot == c) {
    local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_a_const,&local_e8,&local_a8);
    this_00._M_pi =
         local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      this_00._M_pi =
           local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
  }
  else {
    if (ot != v) {
      return;
    }
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&local_30);
    iVar1 = *(int *)((long)local_30 + 0x1c);
    if (local_28 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
    }
    if (iVar1 == 0) {
      local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,&local_b8,&local_48);
      this_00._M_pi =
           local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        this_00._M_pi =
             local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
      }
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&local_30);
      iVar1 = *(int *)((long)local_30 + 0x1c);
      if (local_28 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
      }
      if (iVar1 == 1) {
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
        if (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_c8,&local_58);
        if (local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_68,&local_78);
        this_00._M_pi =
             local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
        if (local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_00._M_pi =
               local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&local_30);
        iVar1 = *(int *)((long)local_30 + 0x1c);
        if (local_28 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
        }
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
        if (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        generateLoadStackR0(this,&local_d8);
        if (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_88,&local_98);
        this_00._M_pi =
             local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
        if (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_00._M_pi =
               local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
    }
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return;
}

Assistant:

void IMC_Generator::generateMoveA( OperationType ot, std::shared_ptr<IM_Operator> op )
	{
		if( ot == OT::v )
		{
			if( op->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, op );
			}
			else if( op->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, op );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( op->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( op );
				addCmd( HexOp::mov_a_atr0 );
			}
		}
		else if( ot == OT::c )
		{
			addCmd( HexOp::mov_a_const, op );
		}
		//Ignore OT::t because it is already correct.
	}